

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_double_sprintf<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,longdouble value,format_specs *spec,basic_buffer<wchar_t> *buffer)

{
  int iVar1;
  type tVar2;
  undefined8 *puVar3;
  size_t size;
  ulong uVar4;
  char_type format [10];
  wchar_t local_48;
  undefined1 local_44 [8];
  undefined4 local_3c [9];
  
  size = buffer->capacity_;
  if (size == 0) {
    __assert_fail("(buffer.capacity() != 0) && \"empty buffer\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/./fmt/format.h"
                  ,0xba7,
                  "void fmt::basic_writer<fmt::back_insert_range<fmt::internal::basic_buffer<wchar_t>>>::write_double_sprintf(T, const format_specs &, internal::basic_buffer<char_type> &) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<wchar_t>>, T = long double]"
                 );
  }
  local_48 = L'%';
  if ((spec->flags_ & 8) == 0) {
    puVar3 = (undefined8 *)local_44;
  }
  else {
    puVar3 = (undefined8 *)(local_44 + 4);
    local_44._0_4_ = 0x23;
  }
  iVar1 = spec->precision_;
  if (-1 < iVar1) {
    *puVar3 = 0x2a0000002e;
    puVar3 = puVar3 + 1;
  }
  *(undefined4 *)puVar3 = 0x4c;
  *(wchar_t *)((long)puVar3 + 4) = spec->type_;
  *(undefined4 *)(puVar3 + 1) = 0;
  do {
    iVar1 = internal::char_traits<wchar_t>::format_float<long_double>
                      (buffer->ptr_,size,&local_48,iVar1,value);
    if (iVar1 < 0) {
      if (buffer->capacity_ != 0xffffffffffffffff) {
        uVar4 = buffer->capacity_ + 1;
        goto LAB_0013e196;
      }
    }
    else {
      tVar2 = internal::to_unsigned<int>(iVar1);
      if ((ulong)tVar2 < buffer->capacity_) {
        internal::basic_buffer<wchar_t>::resize(buffer,(ulong)tVar2);
        return;
      }
      uVar4 = (ulong)(tVar2 + 1);
      if (buffer->capacity_ < uVar4) {
LAB_0013e196:
        (**buffer->_vptr_basic_buffer)(buffer,uVar4);
      }
    }
    size = buffer->capacity_;
    iVar1 = spec->precision_;
  } while( true );
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}